

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

int flatcc_json_printer_struct_as_root
              (flatcc_json_printer_t *ctx,void *buf,size_t bufsiz,char *fid,
              flatcc_json_printer_struct_f *pf)

{
  int iVar1;
  long lVar2;
  char *__s;
  ulong __n;
  char *pcVar3;
  size_t __n_00;
  
  accept_header(ctx,buf,bufsiz,fid);
  ctx->level = ctx->level + 1;
  pcVar3 = ctx->p;
  ctx->p = pcVar3 + 1;
  *pcVar3 = '{';
  (*pf)(ctx,(void *)((ulong)*buf + (long)buf));
  pcVar3 = ctx->p;
  if (ctx->indent != '\0') {
    ctx->p = pcVar3 + 1;
    *pcVar3 = '\n';
    lVar2 = (long)ctx->level + -1;
    ctx->level = (int)lVar2;
    __n = (ulong)ctx->indent * lVar2;
    pcVar3 = ctx->pflush;
    __s = ctx->p;
    if (pcVar3 < __s + __n) {
      if (pcVar3 <= __s) {
        (*ctx->flush)(ctx,0);
        pcVar3 = ctx->pflush;
        __s = ctx->p;
      }
      __n_00 = (long)pcVar3 - (long)__s;
      if (__n_00 < __n) {
        do {
          memset(__s,0x20,__n_00);
          ctx->p = ctx->p + __n_00;
          __n = __n - __n_00;
          (*ctx->flush)(ctx,0);
          __s = ctx->p;
          __n_00 = (long)ctx->pflush - (long)__s;
        } while (__n_00 < __n);
      }
    }
    memset(__s,0x20,__n);
    pcVar3 = ctx->p + __n;
  }
  ctx->p = pcVar3 + 1;
  *pcVar3 = '}';
  if ((ctx->indent != '\0') && (ctx->level == 0)) {
    pcVar3 = ctx->p;
    ctx->p = pcVar3 + 1;
    *pcVar3 = '\n';
  }
  (*ctx->flush)(ctx,1);
  iVar1 = -1;
  if (ctx->error == 0) {
    iVar1 = (*(int *)&ctx->p - *(int *)&ctx->buf) + (int)ctx->total;
  }
  return iVar1;
}

Assistant:

int flatcc_json_printer_struct_as_root(flatcc_json_printer_t *ctx,
        const void *buf, size_t bufsiz, const char *fid,
        flatcc_json_printer_struct_f *pf)
{
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return -1;
    }
    print_start('{');
    pf(ctx, read_uoffset_ptr(buf));
    print_end('}');
    print_last_nl();
    return flatcc_json_printer_get_error(ctx) ? -1 : (int)ctx->total + (int)(ctx->p - ctx->buf);
}